

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::SetCachedSourceString
          (ParseableFunctionInfo *this,JavascriptString *sourceString)

{
  code *pcVar1;
  bool bVar2;
  JavascriptString *pJVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  RecyclerWeakReference<Js::JavascriptString> *weakRef;
  JavascriptString *sourceString_local;
  ParseableFunctionInfo *this_local;
  
  pJVar3 = GetCachedSourceString(this);
  if (pJVar3 != (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7c8,"(this->GetCachedSourceString() == nullptr)",
                                "this->GetCachedSourceString() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (sourceString != (JavascriptString *)0x0) {
    this_00 = FunctionProxy::GetRecycler(&this->super_FunctionProxy);
    weakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::JavascriptString>
                        (this_00,sourceString);
    SetCachedSourceStringWeakRef(this,weakRef);
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetCachedSourceString(JavascriptString * sourceString)
    {
        Assert(this->GetCachedSourceString() == nullptr);
        if (sourceString)
        {
            this->SetCachedSourceStringWeakRef(this->GetRecycler()->CreateWeakReferenceHandle(sourceString));
        }
    }